

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_join.cpp
# Opt level: O0

void __thiscall duckdb::LogicalJoin::ResolveTypes(LogicalJoin *this)

{
  __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  __last;
  long in_RDI;
  vector<duckdb::LogicalType,_true> right_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_ffffffffffffff68;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff70;
  LogicalTypeId *in_stack_ffffffffffffff78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_ffffffffffffff80;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  in_stack_ffffffffffffffc0;
  const_iterator in_stack_ffffffffffffffc8;
  
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_ffffffffffffff70);
  LogicalOperator::MapTypes
            ((vector<duckdb::LogicalType,_true> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (vector<unsigned_long,_true> *)in_stack_ffffffffffffffb0);
  vector<duckdb::LogicalType,_true>::operator=
            (in_stack_ffffffffffffff70,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff68);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe60e78);
  if ((*(char *)(in_RDI + 0x61) != '\x05') && (*(char *)(in_RDI + 0x61) != '\x06')) {
    if (*(char *)(in_RDI + 0x61) == '\a') {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    *)in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
      operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)in_stack_ffffffffffffff70);
      LogicalOperator::MapTypes
                ((vector<duckdb::LogicalType,_true> *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (vector<unsigned_long,_true> *)in_stack_ffffffffffffffb0);
      if ((*(char *)(in_RDI + 0x61) == '\t') || (*(char *)(in_RDI + 0x61) == '\n')) {
        vector<duckdb::LogicalType,_true>::operator=
                  (in_stack_ffffffffffffff70,
                   (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff68);
      }
      else {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                  (in_stack_ffffffffffffff68);
        __gnu_cxx::
        __normal_iterator<duckdb::LogicalType_const*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>
        ::__normal_iterator<duckdb::LogicalType*>
                  ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                    *)in_stack_ffffffffffffff70,
                   (__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                    *)in_stack_ffffffffffffff68);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                  (in_stack_ffffffffffffff68);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                  (in_stack_ffffffffffffff68);
        __last._M_current._4_4_ = in_stack_ffffffffffffffbc;
        __last._M_current._0_4_ = in_stack_ffffffffffffffb8;
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>,void>
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   __last);
      }
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe60fcb);
    }
  }
  return;
}

Assistant:

void LogicalJoin::ResolveTypes() {
	types = MapTypes(children[0]->types, left_projection_map);
	if (join_type == JoinType::SEMI || join_type == JoinType::ANTI) {
		// for SEMI and ANTI join we only project the left hand side
		return;
	}
	if (join_type == JoinType::MARK) {
		// for MARK join we project the left hand side, plus a BOOLEAN column indicating the MARK
		types.emplace_back(LogicalType::BOOLEAN);
		return;
	}
	// for any other join we project both sides
	auto right_types = MapTypes(children[1]->types, right_projection_map);
	if (join_type == JoinType::RIGHT_SEMI || join_type == JoinType::RIGHT_ANTI) {
		types = right_types;
		return;
	}
	types.insert(types.end(), right_types.begin(), right_types.end());
}